

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O0

double trng::math::detail::inv_erfc<double>(double x)

{
  bool bVar1;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  double u;
  double e;
  double y;
  bool flag;
  double local_38;
  double in_stack_ffffffffffffffe8;
  double local_8;
  
  local_8 = in_XMM0_Qa;
  if (1.0 < in_XMM0_Qa) {
    local_8 = -(in_XMM0_Qa - 1.0) + 1.0;
  }
  dVar2 = inv_Phi_approx<double>(in_stack_ffffffffffffffe8);
  local_38 = -dVar2 * 0.7071067811865476;
  bVar1 = std::isfinite(local_38);
  if (bVar1) {
    dVar2 = erfc(local_38);
    dVar3 = exp(local_38 * local_38);
    dVar3 = -(dVar2 - local_8) * 0.886226925452758 * dVar3;
    local_38 = local_38 - dVar3 / (local_38 * dVar3 + 1.0);
  }
  if (1.0 < in_XMM0_Qa) {
    local_38 = -local_38;
  }
  return local_38;
}

Assistant:

TRNG_CUDA_ENABLE T inv_erfc(T x) {
        // step size in the Halley step is proportional to erfc, use symmetry to increase
        // numerical accuracy
        const bool flag{x > 1};
        if (flag)
          x = -(x - 1) + 1;
        T y{-inv_Phi_approx(x / 2) * constants<T>::one_over_sqrt_2};
        // refinement by Halley rational method
        if (isfinite(y)) {
          const T e{erfc(y) - x};
          const T u{-e * (constants<T>::sqrt_pi_over_2) * exp(y * y)};
          y -= u / (1 + y * u);
        }
        // T is a floating point number type with more than 80 bits, a 2nd iteration is
        // required to reach full machine precision
#if __cplusplus >= 201703L
        if constexpr (sizeof(T) > 10) {
#else
#if _MSC_VER
#pragma warning(push)
#pragma warning(disable : 4127)
#endif
        if (sizeof(T) > 10) {
#if _MSC_VER
#pragma warning(pop)
#endif
#endif
          if (isfinite(y)) {
            const T e{erfc(y) - x};
            const T u{-e * (constants<T>::sqrt_pi_over_2) * exp(y * y)};
            y -= u / (1 + y * u);
          }
        }
        return flag ? -y : y;
      }

    }